

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

bool __thiscall
QGraphicsTextItemPrivate::_q_mouseOnEdge
          (QGraphicsTextItemPrivate *this,QGraphicsSceneMouseEvent *event)

{
  byte bVar1;
  QTextFrame *in_RDI;
  long in_FS_OFFSET;
  QPainterPath docPath;
  QPainterPath path;
  QTextFrameFormat format;
  QWidgetTextControl *this_00;
  QGraphicsSceneMouseEvent *this_01;
  qreal xp1;
  QRectF *this_02;
  QPainterPath local_90 [72];
  QGraphicsSceneMouseEvent *local_48;
  QWidgetTextControl local_40;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QGraphicsSceneMouseEvent *)&DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_20);
  this_00 = &local_40;
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x60))();
  QPainterPath::addRect((QRectF *)&local_20);
  local_48 = this_01;
  QPainterPath::QPainterPath((QPainterPath *)&local_48);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document(this_00);
  QTextDocument::rootFrame();
  QTextFrame::frameFormat(in_RDI);
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x60))();
  QTextFrameFormat::leftMargin();
  QTextFrameFormat::topMargin();
  QTextFrameFormat::rightMargin();
  xp1 = -0.0;
  this_02 = (QRectF *)0x8000000000000000;
  QTextFrameFormat::bottomMargin();
  QRectF::adjusted(this_02,xp1,(qreal)in_RDI,(qreal)this_01,(qreal)this_00);
  QPainterPath::addRect((QRectF *)&local_48);
  QPainterPath::subtracted(local_90);
  QGraphicsSceneMouseEvent::pos(this_01);
  bVar1 = QPainterPath::contains((QPointF *)local_90);
  QPainterPath::~QPainterPath(local_90);
  QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x98cb14);
  QPainterPath::~QPainterPath((QPainterPath *)&local_48);
  QPainterPath::~QPainterPath((QPainterPath *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsTextItemPrivate::_q_mouseOnEdge(QGraphicsSceneMouseEvent *event)
{
    QPainterPath path;
    path.addRect(qq->boundingRect());

    QPainterPath docPath;
    const QTextFrameFormat format = control->document()->rootFrame()->frameFormat();
    docPath.addRect(
        qq->boundingRect().adjusted(
            format.leftMargin(),
            format.topMargin(),
            -format.rightMargin(),
            -format.bottomMargin()));

    return path.subtracted(docPath).contains(event->pos());
}